

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Slice(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint nSuppMax;
  Gia_Man_t *pNew;
  char *pcVar3;
  int iVar4;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  nSuppMax = 6;
  while( true ) {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"Svh"), iVar4 = globalUtilOptind, iVar2 == 0x76) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar2 == -1) {
      if (pAbc->pGia != (Gia_Man_t *)0x0) {
        pNew = Gia_ManDupSliced(pAbc->pGia,nSuppMax);
        Abc_FrameUpdateGia(pAbc,pNew);
        return 0;
      }
      pcVar3 = "Abc_CommandAbc9Slice(): There is no AIG.\n";
      iVar4 = -1;
      goto LAB_00259bb2;
    }
    if (iVar2 != 0x53) goto LAB_00259b4f;
    if (argc <= globalUtilOptind) break;
    nSuppMax = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
    if ((int)nSuppMax < 0) {
LAB_00259b4f:
      iVar4 = -2;
      Abc_Print(-2,"usage: &slice [-S num] [-vh]\n");
      Abc_Print(-2,"\t         cuts the lower part of the AIG with nodes using their support\n");
      Abc_Print(-2,"\t-S num : the largest support size to keep in the slide [default = %d]\n",
                (ulong)nSuppMax);
      pcVar3 = "yes";
      if (!bVar1) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
      pcVar3 = "\t-h     : print the command usage\n";
LAB_00259bb2:
      Abc_Print(iVar4,pcVar3);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-S\" should be followed by an integer.\n");
  goto LAB_00259b4f;
}

Assistant:

int Abc_CommandAbc9Slice( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c, nSuppSize = 6, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Svh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            nSuppSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nSuppSize < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Slice(): There is no AIG.\n" );
        return 1;
    }
    pTemp = Gia_ManDupSliced( pAbc->pGia, nSuppSize );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &slice [-S num] [-vh]\n" );
    Abc_Print( -2, "\t         cuts the lower part of the AIG with nodes using their support\n" );
    Abc_Print( -2, "\t-S num : the largest support size to keep in the slide [default = %d]\n", nSuppSize );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}